

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_sock_write_buffer(int fd,fio_packet_s *packet)

{
  int iVar1;
  int written;
  fio_packet_s *packet_local;
  int fd_local;
  
  iVar1 = (**(code **)(*(long *)((long)fio_data + (long)fd * 0xa8 + 0xa8) + 8))
                    ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + (long)fd * 0xa8 + 0x6d)),
                     *(undefined8 *)((long)fio_data + (long)fd * 0xa8 + 0xb0),
                     (long)(packet->data).buffer + packet->offset,packet->length);
  if (0 < iVar1) {
    packet->length = packet->length - (long)iVar1;
    packet->offset = (long)iVar1 + packet->offset;
    if (packet->length == 0) {
      fio_sock_packet_rotate_unsafe((long)fd);
    }
  }
  return iVar1;
}

Assistant:

static int fio_sock_write_buffer(int fd, fio_packet_s *packet) {
  int written = fd_data(fd).rw_hooks->write(
      fd2uuid(fd), fd_data(fd).rw_udata,
      ((uint8_t *)packet->data.buffer + packet->offset), packet->length);
  if (written > 0) {
    packet->length -= written;
    packet->offset += written;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
    }
  }
  return written;
}